

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

FIOBJ http_mimetype_find2(FIOBJ url)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  FIOBJ FVar4;
  char *pcVar5;
  char cVar6;
  byte bVar7;
  fiobj_object_vtable_s *pfVar8;
  __int32_t **pp_Var9;
  FIOBJ FVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  char *file_ext;
  long lVar15;
  size_t file_ext_len;
  long *in_FS_OFFSET;
  fio_str_info_s tmp;
  fio_str_info_s local_48;
  
  if (url != 0) {
    if ((url & 1) == 0) {
      uVar12 = (uint)url & 6;
      cVar6 = '(';
      switch(uVar12) {
      case 0:
switchD_0014ebcb_caseD_0:
        cVar6 = *(char *)(url & 0xfffffffffffffff8);
        break;
      case 4:
switchD_0014ebcb_caseD_4:
        cVar6 = '*';
        break;
      case 6:
        if ((char)url == '&') {
          local_48.data = anon_var_dwarf_21a;
          local_48.len._0_4_ = 5;
        }
        else {
          uVar14 = (uint)url & 0xff;
          if (uVar14 == 0x16) {
            local_48.data = anon_var_dwarf_225;
            local_48.len._0_4_ = 4;
          }
          else {
            if (uVar14 != 6) {
              switch(uVar12) {
              case 0:
                goto switchD_0014ebcb_caseD_0;
              case 4:
                goto switchD_0014ebcb_caseD_4;
              case 6:
                cVar6 = (char)url;
              }
              break;
            }
            local_48.data = anon_var_dwarf_20f;
            local_48.len._0_4_ = 4;
          }
        }
        local_48.capa._0_4_ = 0;
        local_48.capa._4_4_ = 0;
        local_48.len._4_4_ = 0;
        goto LAB_0014eca6;
      }
      switch(cVar6) {
      case '\'':
        pfVar8 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        pfVar8 = &FIOBJECT_VTABLE_STRING;
        break;
      case ')':
        pfVar8 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        pfVar8 = &FIOBJECT_VTABLE_HASH;
        break;
      case '+':
        pfVar8 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar8 = &FIOBJECT_VTABLE_NUMBER;
      }
      (*pfVar8->to_str)(&local_48,url);
    }
    else {
      fio_ltocstr(&local_48,(long)url >> 1);
    }
LAB_0014eca6:
    pcVar5 = local_48.data;
    uVar3 = CONCAT44(local_48.len._4_4_,(undefined4)local_48.len);
    file_ext = (char *)0x0;
    file_ext_len = 0;
    if (uVar3 < 2) goto LAB_0014ed62;
    uVar13 = 1;
    bVar7 = 0;
    do {
      if (local_48.data[uVar3 - uVar13] == '/') break;
      if (local_48.data[uVar3 - uVar13] == '.') {
        if (bVar7 != 0) {
          file_ext_len = (size_t)bVar7;
          lVar2 = *in_FS_OFFSET;
          file_ext = (char *)(lVar2 + -0x10);
          *(undefined1 *)((long)in_FS_OFFSET + (file_ext_len - 0x10)) = 0;
          pp_Var9 = __ctype_tolower_loc();
          lVar15 = 0;
          do {
            *(char *)(file_ext_len + lVar2 + -0x11 + lVar15) =
                 (char)(*pp_Var9)[pcVar5[lVar15 + (uVar3 - 1)]];
            lVar15 = lVar15 + -1;
          } while (-lVar15 != file_ext_len);
          goto LAB_0014ed62;
        }
        break;
      }
      bVar11 = bVar7 + 2;
      uVar13 = (ulong)bVar11;
      bVar7 = bVar7 + 1;
    } while (0xe < bVar11 || uVar13 < uVar3);
  }
  file_ext = (char *)0x0;
  file_ext_len = 0;
LAB_0014ed62:
  FVar10 = http_mimetype_find(file_ext,file_ext_len);
  FVar4 = HTTP_HVALUE_CONTENT_TYPE_DEFAULT;
  if ((((FVar10 == 0) && (FVar10 = FVar4, (~(uint)HTTP_HVALUE_CONTENT_TYPE_DEFAULT & 6) != 0)) &&
      (HTTP_HVALUE_CONTENT_TYPE_DEFAULT != 0)) && ((HTTP_HVALUE_CONTENT_TYPE_DEFAULT & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((HTTP_HVALUE_CONTENT_TYPE_DEFAULT & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return FVar10;
}

Assistant:

FIOBJ http_mimetype_find2(FIOBJ url) {
  static __thread char buffer[LONGEST_FILE_EXTENSION_LENGTH + 1];
  fio_str_info_s ext = {.data = NULL};
  FIOBJ mimetype;
  if (!url)
    goto finish;
  fio_str_info_s tmp = fiobj_obj2cstr(url);
  uint8_t steps = 1;
  while (tmp.len > steps || steps >= LONGEST_FILE_EXTENSION_LENGTH) {
    switch (tmp.data[tmp.len - steps]) {
    case '.':
      --steps;
      if (steps) {
        ext.len = steps;
        ext.data = buffer;
        buffer[steps] = 0;
        for (size_t i = 1; i <= steps; ++i) {
          buffer[steps - i] = tolower(tmp.data[tmp.len - i]);
        }
      }
    /* fallthrough */
    case '/':
      goto finish;
      break;
    }
    ++steps;
  }
finish:
  mimetype = http_mimetype_find(ext.data, ext.len);
  if (!mimetype)
    mimetype = fiobj_dup(HTTP_HVALUE_CONTENT_TYPE_DEFAULT);
  return mimetype;
}